

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiMaterial *pMaterial)

{
  uint uVar1;
  aiPropertyTypeInfo aVar2;
  aiMaterialProperty *paVar3;
  aiReturn aVar4;
  undefined8 in_RAX;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  ValidateDSProcess *pVVar8;
  undefined8 uVar9;
  ai_real fTemp;
  int iShading;
  undefined8 local_18;
  
  uVar5 = (ulong)pMaterial->mNumProperties;
  if (uVar5 != 0) {
    uVar6 = 0;
    pVVar8 = this;
    do {
      paVar3 = pMaterial->mProperties[uVar6];
      if (paVar3 == (aiMaterialProperty *)0x0) {
        pcVar7 = "aiMaterial::mProperties[%i] is NULL (aiMaterial::mNumProperties is %i)";
LAB_0013e3d9:
        ReportError(pVVar8,pcVar7,uVar6,uVar5);
      }
      uVar1 = paVar3->mDataLength;
      if ((uVar1 == 0) ||
         (pVVar8 = (ValidateDSProcess *)paVar3->mData, pVVar8 == (ValidateDSProcess *)0x0)) {
        pcVar7 = "aiMaterial::mProperties[%i].mDataLength or aiMaterial::mProperties[%i].mData is 0"
        ;
        uVar5 = uVar6 & 0xffffffff;
        goto LAB_0013e3d9;
      }
      aVar2 = paVar3->mType;
      if (aVar2 == aiPTI_Float) {
        if (uVar1 < 4) {
          pcVar7 = 
          "aiMaterial::mProperties[%i].mDataLength is too small to contain a float (%i, needed: %i)"
          ;
LAB_0013e40f:
          uVar9 = 4;
LAB_0013e417:
          ReportError(pVVar8,pcVar7,uVar6,(ulong)uVar1,uVar9);
        }
      }
      else if (aVar2 == aiPTI_Integer) {
        if (uVar1 < 4) {
          pcVar7 = 
          "aiMaterial::mProperties[%i].mDataLength is too small to contain an integer (%i, needed: %i)"
          ;
          goto LAB_0013e40f;
        }
      }
      else if (aVar2 == aiPTI_String) {
        if ((uVar1 < 5) || (uVar1 < *(int *)&(pVVar8->super_BaseProcess)._vptr_BaseProcess + 5U)) {
          pcVar7 = 
          "aiMaterial::mProperties[%i].mDataLength is too small to contain a string (%i, needed: %i)"
          ;
          uVar9 = 0x404;
          goto LAB_0013e417;
        }
        if (*(char *)((long)&(pVVar8->super_BaseProcess)._vptr_BaseProcess + (ulong)(uVar1 - 1)) !=
            '\0') {
          ReportError(pVVar8,"Missing null-terminator in string material property");
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  local_18 = in_RAX;
  aVar4 = aiGetMaterialIntegerArray
                    (pMaterial,"$mat.shadingm",0,0,(int *)((long)&local_18 + 4),(uint *)0x0);
  if (((aVar4 == aiReturn_SUCCESS) && (local_18._4_4_ < 9)) &&
     ((0x118U >> (local_18._4_4_ & 0x1f) & 1) != 0)) {
    pVVar8 = (ValidateDSProcess *)pMaterial;
    aVar4 = aiGetMaterialFloatArray(pMaterial,"$mat.shininess",0,0,(ai_real *)&local_18,(uint *)0x0)
    ;
    if (aVar4 != aiReturn_SUCCESS) {
      ReportWarning(pVVar8,
                    "A specular shading model is specified but there is no AI_MATKEY_SHININESS key")
      ;
    }
    pVVar8 = (ValidateDSProcess *)pMaterial;
    aVar4 = aiGetMaterialFloatArray
                      (pMaterial,"$mat.shinpercent",0,0,(ai_real *)&local_18,(uint *)0x0);
    if (aVar4 == aiReturn_SUCCESS) {
      if (((float)local_18 == 0.0) && (!NAN((float)local_18))) {
        ReportWarning(pVVar8,
                      "A specular shading model is specified but the value of the AI_MATKEY_SHININESS_STRENGTH key is 0.0"
                     );
      }
    }
  }
  pVVar8 = (ValidateDSProcess *)pMaterial;
  aVar4 = aiGetMaterialFloatArray(pMaterial,"$mat.opacity",0,0,(ai_real *)&local_18,(uint *)0x0);
  if (aVar4 == aiReturn_SUCCESS) {
    if ((((float)local_18 == 0.0) && (!NAN((float)local_18))) || (1.01 < (float)local_18)) {
      ReportWarning(pVVar8,"Invalid opacity value (must be 0 < opacity < 1.0)");
    }
  }
  SearchForInvalidTextures(this,pMaterial,aiTextureType_DIFFUSE);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_SPECULAR);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_AMBIENT);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_EMISSIVE);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_OPACITY);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_SHININESS);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_HEIGHT);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_NORMALS);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_DISPLACEMENT);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_LIGHTMAP);
  SearchForInvalidTextures(this,pMaterial,aiTextureType_REFLECTION);
  return;
}

Assistant:

void ValidateDSProcess::Validate( const aiMaterial* pMaterial)
{
    // check whether there are material keys that are obviously not legal
    for (unsigned int i = 0; i < pMaterial->mNumProperties;++i)
    {
        const aiMaterialProperty* prop = pMaterial->mProperties[i];
        if (!prop)  {
            ReportError("aiMaterial::mProperties[%i] is NULL (aiMaterial::mNumProperties is %i)",
                i,pMaterial->mNumProperties);
        }
        if (!prop->mDataLength || !prop->mData) {
            ReportError("aiMaterial::mProperties[%i].mDataLength or "
                "aiMaterial::mProperties[%i].mData is 0",i,i);
        }
        // check all predefined types
        if (aiPTI_String == prop->mType)    {
            // FIX: strings are now stored in a less expensive way, but we can't use the
            // validation routine for 'normal' aiStrings
            if (prop->mDataLength < 5 || prop->mDataLength < 4 + (*reinterpret_cast<uint32_t*>(prop->mData)) + 1)   {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain a string (%i, needed: %i)",
                    i,prop->mDataLength,static_cast<int>(sizeof(aiString)));
            }
            if(prop->mData[prop->mDataLength-1]) {
                ReportError("Missing null-terminator in string material property");
            }
        //  Validate((const aiString*)prop->mData);
        }
        else if (aiPTI_Float == prop->mType)    {
            if (prop->mDataLength < sizeof(float))  {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain a float (%i, needed: %i)",
                    i,prop->mDataLength, static_cast<int>(sizeof(float)));
            }
        }
        else if (aiPTI_Integer == prop->mType)  {
            if (prop->mDataLength < sizeof(int))    {
                ReportError("aiMaterial::mProperties[%i].mDataLength is "
                    "too small to contain an integer (%i, needed: %i)",
                    i,prop->mDataLength, static_cast<int>(sizeof(int)));
            }
        }
        // TODO: check whether there is a key with an unknown name ...
    }

    // make some more specific tests
    ai_real fTemp;
    int iShading;
    if (AI_SUCCESS == aiGetMaterialInteger( pMaterial,AI_MATKEY_SHADING_MODEL,&iShading))   {
        switch ((aiShadingMode)iShading)
        {
        case aiShadingMode_Blinn:
        case aiShadingMode_CookTorrance:
        case aiShadingMode_Phong:

            if (AI_SUCCESS != aiGetMaterialFloat(pMaterial,AI_MATKEY_SHININESS,&fTemp)) {
                ReportWarning("A specular shading model is specified but there is no "
                    "AI_MATKEY_SHININESS key");
            }
            if (AI_SUCCESS == aiGetMaterialFloat(pMaterial,AI_MATKEY_SHININESS_STRENGTH,&fTemp) && !fTemp)  {
                ReportWarning("A specular shading model is specified but the value of the "
                    "AI_MATKEY_SHININESS_STRENGTH key is 0.0");
            }
            break;
        default:
            break;
        }
    }

    if (AI_SUCCESS == aiGetMaterialFloat( pMaterial,AI_MATKEY_OPACITY,&fTemp) && (!fTemp || fTemp > 1.01)) {
        ReportWarning("Invalid opacity value (must be 0 < opacity < 1.0)");
    }

    // Check whether there are invalid texture keys
    // TODO: that's a relict of the past, where texture type and index were baked
    // into the material string ... we could do that in one single pass.
    SearchForInvalidTextures(pMaterial,aiTextureType_DIFFUSE);
    SearchForInvalidTextures(pMaterial,aiTextureType_SPECULAR);
    SearchForInvalidTextures(pMaterial,aiTextureType_AMBIENT);
    SearchForInvalidTextures(pMaterial,aiTextureType_EMISSIVE);
    SearchForInvalidTextures(pMaterial,aiTextureType_OPACITY);
    SearchForInvalidTextures(pMaterial,aiTextureType_SHININESS);
    SearchForInvalidTextures(pMaterial,aiTextureType_HEIGHT);
    SearchForInvalidTextures(pMaterial,aiTextureType_NORMALS);
    SearchForInvalidTextures(pMaterial,aiTextureType_DISPLACEMENT);
    SearchForInvalidTextures(pMaterial,aiTextureType_LIGHTMAP);
    SearchForInvalidTextures(pMaterial,aiTextureType_REFLECTION);
}